

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.cpp
# Opt level: O1

void __thiscall
qclab::qgates::iSWAP<std::complex<double>_>::apply
          (iSWAP<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  int iVar1;
  char *__assertion;
  int target;
  uint uVar2;
  CNOT<std::complex<double>_> CNOT;
  Phase90<std::complex<double>_> S;
  Hadamard<std::complex<double>_> H;
  CX<std::complex<double>_> local_70;
  Phase90<std::complex<double>_> local_58;
  ulong local_48;
  Hadamard<std::complex<double>_> local_40;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/iSWAP.cpp"
                  ,0x25,
                  "virtual void qclab::qgates::iSWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  if (matrix->size_ != (long)(1 << ((byte)nbQubits & 0x1f))) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/iSWAP.cpp"
                  ,0x26,
                  "virtual void qclab::qgates::iSWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  uVar2 = (this->qubits_)._M_elems[0];
  local_48 = (ulong)uVar2;
  uVar2 = uVar2 + offset;
  if ((int)uVar2 < nbQubits) {
    iVar1 = (this->qubits_)._M_elems[1];
    target = offset + iVar1;
    if (target < nbQubits) {
      local_58.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
      _vptr_QObject = (_func_int **)&PTR_nbQubits_0051ff08;
      local_58.super_QGate1<std::complex<double>_>.qubit_ = uVar2;
      if ((int)uVar2 < 0) {
        __assert_fail("qubit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                      ,0x21,
                      "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
                     );
      }
      local_58.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
      _vptr_QObject = (_func_int **)&PTR_nbQubits_005234d8;
      local_40.super_QGate1<std::complex<double>_>.super_QObject<std::complex<double>_>.
      _vptr_QObject = (_func_int **)&PTR_nbQubits_005200d0;
      local_40.super_QGate1<std::complex<double>_>.qubit_ = uVar2;
      CX<std::complex<double>_>::CX(&local_70,uVar2,target,1);
      Phase90<std::complex<double>_>::apply(&local_58,side,op,nbQubits,matrix,0);
      if (-1 < target) {
        local_58.super_QGate1<std::complex<double>_>.qubit_ = target;
        Phase90<std::complex<double>_>::apply(&local_58,side,op,nbQubits,matrix,0);
        Hadamard<std::complex<double>_>::apply(&local_40,side,op,nbQubits,matrix,0);
        CX<std::complex<double>_>::apply(&local_70,side,op,nbQubits,matrix,0);
        if (iVar1 != (int)local_48) {
          local_70.super_QControlledGate2<std::complex<double>_>.control_ = target;
          (**(_func_int **)
             ((long)local_70.super_QControlledGate2<std::complex<double>_>.
                    super_QGate2<std::complex<double>_>.super_QObject<std::complex<double>_>.
                    _vptr_QObject + 0x88))(&local_70,(ulong)uVar2);
          CX<std::complex<double>_>::apply(&local_70,side,op,nbQubits,matrix,0);
          local_40.super_QGate1<std::complex<double>_>.qubit_ = target;
          Hadamard<std::complex<double>_>::apply(&local_40,side,op,nbQubits,matrix,0);
          local_70.super_QControlledGate2<std::complex<double>_>.super_QGate2<std::complex<double>_>
          .super_QObject<std::complex<double>_>._vptr_QObject =
               (QObject<std::complex<double>_>)&PTR_nbQubits_00520170;
          if ((_Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
               )local_70.gate_._M_t.
                super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                .super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>.
                _M_head_impl != (PauliX<std::complex<double>_> *)0x0) {
            (**(code **)(*(long *)local_70.gate_._M_t.
                                  super___uniq_ptr_impl<qclab::qgates::PauliX<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliX<std::complex<double>_>_>_>
                                  .
                                  super__Head_base<0UL,_qclab::qgates::PauliX<std::complex<double>_>_*,_false>
                                  ._M_head_impl + 0x68))();
          }
          return;
        }
        __assert_fail("qubits[0] != qubits[1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QControlledGate2.hpp"
                      ,0x3a,
                      "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::setQubits(const int *) [T = std::complex<double>]"
                     );
      }
      __assert_fail("qubit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                    ,0x31,
                    "virtual void qclab::qgates::QGate1<std::complex<double>>::setQubit(const int) [T = std::complex<double>]"
                   );
    }
    __assertion = "qubit1 < nbQubits";
  }
  else {
    __assertion = "qubit0 < nbQubits";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/iSWAP.cpp"
                ,0x29,
                "virtual void qclab::qgates::iSWAP<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void iSWAP< T >::apply( Side side , Op op , const int nbQubits ,
                          qclab::dense::SquareMatrix< T >& matrix ,
                          const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    const int qubit0 = qubits_[0] + offset ;
    const int qubit1 = qubits_[1] + offset ;
    assert( qubit0 < nbQubits ) ; assert( qubit1 < nbQubits ) ;
    //
    // -/-----\-   -[S]-[H]--*--[X]-----   -----[X]--*--[H]-[S]-
    //  |iSWAP|  =           |   |       =       |   |
    // -\-----/-   -[S]-----[X]--*--[H]-   -[H]--*--[X]-----[S]-
    //
    qclab::qgates::Phase90< T >  S( qubit0 ) ;
    qclab::qgates::Hadamard< T > H( qubit0 ) ;
    qclab::qgates::CNOT< T >     CNOT( qubit0 , qubit1 ) ;
    // layer 1
    S.apply( side , op , nbQubits , matrix ) ;
    S.setQubit( qubit1 ) ;
    S.apply( side , op , nbQubits , matrix ) ;
    // layer 2
    H.apply( side , op , nbQubits , matrix ) ;
    // layer 3
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 4
    int qnew[] = { qubit1 , qubit0 } ;
    CNOT.setQubits( &qnew[0] ) ;
    CNOT.apply( side , op , nbQubits , matrix ) ;
    // layer 5
    H.setQubit( qubit1 ) ;
    H.apply( side , op , nbQubits , matrix ) ;
  }